

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::InnerProduct_x86_avx512::create_pipeline_fp16s(InnerProduct_x86_avx512 *this,Option *opt)

{
  Mat *this_00;
  uint _h;
  void *pvVar1;
  size_t sVar2;
  int *piVar3;
  Allocator *pAVar4;
  unsigned_short uVar5;
  uint _w;
  uint uVar6;
  uint uVar7;
  Mat *this_01;
  long lVar8;
  void *pvVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  void *pvVar13;
  byte bVar14;
  long lVar15;
  int iVar16;
  undefined1 (*pauVar17) [16];
  undefined1 (*pauVar18) [16];
  void *pvVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  unsigned_short *puVar31;
  long lVar32;
  long lVar33;
  ulong uVar34;
  long lVar35;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  void *local_200;
  ulong local_1f0;
  void *local_1e8;
  void *local_1e0;
  void *local_1d8;
  void *local_1d0;
  long local_1c8;
  long local_1c0;
  long local_1b8;
  long local_1b0;
  long local_1a8;
  long local_198;
  long local_190;
  long local_188;
  long local_180;
  ulong local_168;
  Mat local_158;
  undefined8 local_110;
  void *local_108;
  void *local_100;
  void *local_f8;
  uint local_ec;
  Option *local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  void *local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  void *local_48;
  void *local_40;
  void *local_38;
  
  _h = (this->super_InnerProduct).num_output;
  _w = (this->super_InnerProduct).weight_data_size / (int)_h;
  bVar14 = 1;
  if (opt->use_packing_layout == true) {
    if ((_h & 0xf) == 0) {
      bVar14 = 0x10;
    }
    else if ((_h & 7) == 0) {
      bVar14 = 8;
    }
    else {
      bVar14 = ((_h & 3) == 0) * '\x03' + 1;
    }
  }
  this_00 = &(this->super_InnerProduct).weight_data;
  this_01 = &this->weight_data_tm;
  local_e8 = opt;
  if (7 < bVar14) {
    if (bVar14 != 8) {
      if (bVar14 == 0x10) {
        Mat::reshape(&local_158,this_00,_w,_h,(Allocator *)0x0);
        uVar7 = _h + 0xf;
        if (-1 < (int)_h) {
          uVar7 = _h;
        }
        Mat::create(this_01,_w,(int)uVar7 >> 4,0x20,0x10,(Allocator *)0x0);
        if (0xf < (int)_h) {
          local_ec = _w & 0xfffffff0;
          lVar33 = 1;
          lVar24 = 2;
          lVar30 = 3;
          lVar10 = 4;
          lVar26 = 5;
          lVar20 = 6;
          lVar27 = 7;
          lVar22 = 8;
          lVar11 = 9;
          local_a8 = 10;
          local_b0 = 0xb;
          local_b8 = 0xc;
          local_c0 = 0xd;
          local_c8 = 0xe;
          local_d0 = 0xf;
          local_d8 = 0;
          local_168 = 0;
          do {
            lVar28 = (long)(this->weight_data_tm).w;
            pvVar1 = (this->weight_data_tm).data;
            sVar2 = (this->weight_data_tm).elemsize;
            lVar12 = (long)local_158.w;
            if ((int)_w < 0x10) {
              lVar29 = (local_168 >> 4) * lVar28 * sVar2;
              lVar12 = local_158.elemsize * lVar12;
              local_1a8 = (local_168 | 1) * lVar12;
              lVar32 = (local_168 | 2) * lVar12;
              local_1b0 = (local_168 | 3) * lVar12;
              local_1c0 = (local_168 | 4) * lVar12;
              local_1c8 = (local_168 | 5) * lVar12;
              local_1b8 = (local_168 | 6) * lVar12;
              lVar15 = (local_168 | 7) * lVar12;
              lVar35 = (local_168 | 8) * lVar12;
              local_190 = (local_168 | 9) * lVar12;
              local_180 = (local_168 | 10) * lVar12;
              lVar8 = (local_168 | 0xb) * lVar12;
              lVar25 = (local_168 | 0xc) * lVar12;
              lVar21 = (local_168 | 0xd) * lVar12;
              local_188 = (local_168 | 0xe) * lVar12;
              lVar23 = lVar12 * (local_168 | 0xf);
              lVar28 = lVar12 * local_168;
              uVar7 = 0;
            }
            else {
              local_98 = sVar2 * local_d8 * lVar28;
              local_e0 = local_158.elemsize * local_168 * lVar12;
              local_1a8 = local_158.elemsize * lVar33 * lVar12;
              lVar32 = local_158.elemsize * lVar24 * lVar12;
              local_1b0 = local_158.elemsize * lVar30 * lVar12;
              local_1c0 = local_158.elemsize * lVar10 * lVar12;
              local_1c8 = local_158.elemsize * lVar26 * lVar12;
              local_1b8 = local_158.elemsize * lVar20 * lVar12;
              lVar15 = local_158.elemsize * lVar27 * lVar12;
              lVar35 = local_158.elemsize * lVar22 * lVar12;
              local_190 = local_158.elemsize * lVar11 * lVar12;
              local_180 = local_158.elemsize * local_a8 * lVar12;
              lVar8 = local_158.elemsize * local_b0 * lVar12;
              lVar25 = local_158.elemsize * local_b8 * lVar12;
              lVar21 = local_158.elemsize * local_c0 * lVar12;
              local_188 = local_158.elemsize * local_c8 * lVar12;
              lVar12 = local_158.elemsize * local_d0 * lVar12;
              local_f8 = (void *)((long)local_158.data + local_e0);
              local_100 = (void *)((long)local_158.data + local_1a8);
              local_108 = (void *)((long)local_158.data + lVar32);
              local_110 = (void *)((long)local_158.data + local_1b0);
              local_38 = (void *)((long)local_158.data + local_1c0);
              local_40 = (void *)((long)local_158.data + local_1c8);
              local_48 = (void *)((long)local_158.data + local_1b8);
              local_90 = local_158.data;
              iVar16 = 0xf;
              lVar29 = 0;
              lVar23 = 0;
              do {
                auVar36 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_f8 + lVar23),3);
                auVar37 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_100 + lVar23),3);
                auVar38 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_108 + lVar23),3);
                auVar39 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_110 + lVar23),3);
                auVar40 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_38 + lVar23),3);
                auVar41 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_40 + lVar23),3);
                auVar42 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_48 + lVar23),3);
                auVar43 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                             ((long)local_158.data + lVar23 + lVar15),3);
                auVar44 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                             ((long)local_158.data + lVar23 + lVar35),3);
                auVar45 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                             ((long)local_158.data + lVar23 + local_190),3);
                auVar46 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                             ((long)local_158.data + lVar23 + local_180),3);
                auVar47 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                             ((long)local_158.data + lVar23 + lVar8),3);
                auVar48 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                             ((long)local_158.data + lVar23 + lVar25),3);
                auVar49 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                             ((long)local_158.data + lVar23 + lVar21),3);
                auVar50 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                             ((long)local_158.data + lVar23 + local_188),3);
                auVar51 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                             ((long)local_158.data + lVar23 + lVar12),3);
                auVar52 = vpunpcklwd_avx512vl(auVar36,auVar37);
                auVar36 = vpunpckhwd_avx2(auVar36,auVar37);
                auVar56 = vpunpcklwd_avx2(auVar38,auVar39);
                auVar37 = vpunpckhwd_avx2(auVar38,auVar39);
                auVar57 = vpunpcklwd_avx2(auVar40,auVar41);
                auVar38 = vpunpckhwd_avx2(auVar40,auVar41);
                auVar58 = vpunpcklwd_avx2(auVar42,auVar43);
                auVar39 = vpunpckhwd_avx2(auVar42,auVar43);
                auVar69 = vpunpcklwd_avx2(auVar44,auVar45);
                auVar40 = vpunpckhwd_avx2(auVar44,auVar45);
                auVar44 = vpunpcklwd_avx2(auVar46,auVar47);
                auVar41 = vpunpckhwd_avx2(auVar46,auVar47);
                auVar45 = vpunpcklwd_avx2(auVar48,auVar49);
                auVar42 = vpunpckhwd_avx2(auVar48,auVar49);
                auVar46 = vpunpcklwd_avx2(auVar50,auVar51);
                auVar43 = vpunpckhwd_avx2(auVar50,auVar51);
                auVar47 = vpunpckldq_avx512vl(auVar52,auVar56);
                auVar48 = vpunpckhdq_avx512vl(auVar52,auVar56);
                auVar49 = vpunpckldq_avx512vl(auVar36,auVar37);
                auVar36 = vpunpckhdq_avx2(auVar36,auVar37);
                auVar56 = vpunpckldq_avx2(auVar57,auVar58);
                auVar37 = vpunpckhdq_avx2(auVar57,auVar58);
                auVar57 = vpunpckldq_avx2(auVar38,auVar39);
                auVar38 = vpunpckhdq_avx2(auVar38,auVar39);
                auVar58 = vpunpckldq_avx2(auVar69,auVar44);
                auVar39 = vpunpckhdq_avx2(auVar69,auVar44);
                auVar69 = vpunpckldq_avx2(auVar40,auVar41);
                auVar40 = vpunpckhdq_avx2(auVar40,auVar41);
                auVar44 = vpunpckldq_avx2(auVar45,auVar46);
                auVar41 = vpunpckhdq_avx2(auVar45,auVar46);
                auVar45 = vpunpckldq_avx2(auVar42,auVar43);
                auVar42 = vpunpckhdq_avx2(auVar42,auVar43);
                auVar46 = vpunpcklqdq_avx2(auVar47,auVar56);
                auVar43 = vpunpckhqdq_avx2(auVar47,auVar56);
                auVar56 = vpunpcklqdq_avx2(auVar48,auVar37);
                auVar37 = vpunpckhqdq_avx2(auVar48,auVar37);
                auVar47 = vpunpcklqdq_avx512vl(auVar49,auVar57);
                auVar48 = vpunpckhqdq_avx512vl(auVar49,auVar57);
                auVar49 = vpunpcklqdq_avx512vl(auVar36,auVar38);
                auVar36 = vpunpckhqdq_avx2(auVar36,auVar38);
                auVar57 = vpunpcklqdq_avx2(auVar58,auVar44);
                auVar38 = vpunpckhqdq_avx2(auVar58,auVar44);
                auVar58 = vpunpcklqdq_avx2(auVar39,auVar41);
                auVar39 = vpunpckhqdq_avx2(auVar39,auVar41);
                auVar44 = vpunpcklqdq_avx2(auVar69,auVar45);
                auVar41 = vpunpckhqdq_avx2(auVar69,auVar45);
                auVar69 = vpunpcklqdq_avx2(auVar40,auVar42);
                auVar40 = vpunpckhqdq_avx2(auVar40,auVar42);
                auVar73._0_16_ = ZEXT116(0) * auVar57._0_16_ + ZEXT116(1) * auVar46._0_16_;
                auVar73._16_16_ = ZEXT116(0) * auVar46._16_16_ + ZEXT116(1) * auVar57._0_16_;
                auVar45 = vinserti32x4_avx512vl(auVar43,auVar38._0_16_,1);
                auVar50 = vinserti32x4_avx512vl(auVar56,auVar58._0_16_,1);
                auVar51 = vinserti32x4_avx512vl(auVar37,auVar39._0_16_,1);
                auVar52 = vinserti32x4_avx512vl(auVar47,auVar44._0_16_,1);
                auVar53 = vinserti32x4_avx512vl(auVar48,auVar41._0_16_,1);
                auVar54 = vinserti32x4_avx512vl(auVar49,auVar69._0_16_,1);
                auVar55 = vinserti32x4_avx512vl(auVar36,auVar40._0_16_,1);
                auVar42 = vperm2i128_avx2(auVar46,auVar57,0x31);
                auVar38 = vperm2i128_avx2(auVar43,auVar38,0x31);
                auVar43 = vperm2i128_avx2(auVar56,auVar58,0x31);
                auVar37 = vperm2i128_avx2(auVar37,auVar39,0x31);
                auVar39 = vperm2i128_avx2(auVar47,auVar44,0x31);
                auVar41 = vperm2i128_avx2(auVar48,auVar41,0x31);
                auVar56 = vshufi64x2_avx512vl(auVar49,auVar69,3);
                auVar40 = vperm2i128_avx2(auVar36,auVar40,0x31);
                *(undefined1 (*) [32])((long)pvVar1 + lVar23 * 8 + local_98) = auVar73;
                auVar36 = vmovdqu64_avx512vl(auVar45);
                *(undefined1 (*) [32])((long)pvVar1 + lVar23 * 8 + local_98 + 0x20) = auVar36;
                auVar36 = vmovdqu64_avx512vl(auVar50);
                *(undefined1 (*) [32])((long)pvVar1 + lVar23 * 8 + local_98 + 0x40) = auVar36;
                auVar36 = vmovdqu64_avx512vl(auVar51);
                *(undefined1 (*) [32])((long)pvVar1 + lVar23 * 8 + local_98 + 0x60) = auVar36;
                auVar36 = vmovdqu64_avx512vl(auVar52);
                *(undefined1 (*) [32])((long)pvVar1 + lVar23 * 8 + local_98 + 0x80) = auVar36;
                auVar36 = vmovdqu64_avx512vl(auVar53);
                *(undefined1 (*) [32])((long)pvVar1 + lVar23 * 8 + local_98 + 0xa0) = auVar36;
                auVar36 = vmovdqu64_avx512vl(auVar54);
                *(undefined1 (*) [32])((long)pvVar1 + lVar23 * 8 + local_98 + 0xc0) = auVar36;
                auVar36 = vmovdqu64_avx512vl(auVar55);
                *(undefined1 (*) [32])((long)pvVar1 + lVar23 * 8 + local_98 + 0xe0) = auVar36;
                *(undefined1 (*) [32])((long)pvVar1 + lVar23 * 8 + local_98 + 0x100) = auVar42;
                *(undefined1 (*) [32])((long)pvVar1 + lVar23 * 8 + local_98 + 0x120) = auVar38;
                *(undefined1 (*) [32])((long)pvVar1 + lVar23 * 8 + local_98 + 0x140) = auVar43;
                *(undefined1 (*) [32])((long)pvVar1 + lVar23 * 8 + local_98 + 0x160) = auVar37;
                *(undefined1 (*) [32])((long)pvVar1 + lVar23 * 8 + local_98 + 0x180) = auVar39;
                *(undefined1 (*) [32])((long)pvVar1 + lVar23 * 8 + local_98 + 0x1a0) = auVar41;
                *(undefined1 (*) [32])((long)pvVar1 + lVar23 * 8 + local_98 + 0x1c0) = auVar56;
                *(undefined1 (*) [32])((long)pvVar1 + lVar23 * 8 + local_98 + 0x1e0) = auVar40;
                lVar23 = lVar23 + 0x40;
                lVar29 = lVar29 + 0x200;
                iVar16 = iVar16 + 0x10;
              } while (iVar16 < (int)_w);
              lVar29 = local_98 + lVar29;
              lVar28 = local_e0 + lVar23;
              local_1a8 = local_1a8 + lVar23;
              lVar32 = lVar32 + lVar23;
              local_1b0 = local_1b0 + lVar23;
              local_1c0 = local_1c0 + lVar23;
              local_1c8 = local_1c8 + lVar23;
              local_1b8 = local_1b8 + lVar23;
              lVar15 = lVar15 + lVar23;
              lVar35 = lVar35 + lVar23;
              local_190 = local_190 + lVar23;
              local_180 = local_180 + lVar23;
              lVar8 = lVar8 + lVar23;
              lVar25 = lVar25 + lVar23;
              lVar21 = lVar21 + lVar23;
              local_188 = local_188 + lVar23;
              lVar23 = lVar12 + lVar23;
              uVar7 = local_ec;
            }
            lVar29 = (long)pvVar1 + lVar29;
            local_188 = (long)local_158.data + local_188;
            local_190 = (long)local_158.data + local_190;
            local_1a8 = (long)local_158.data + local_1a8;
            local_1b0 = (long)local_158.data + local_1b0;
            local_1b8 = (long)local_158.data + local_1b8;
            local_1e0 = (void *)((long)local_158.data + lVar25);
            local_1f0 = (long)local_158.data + lVar32;
            local_1d0 = (void *)((long)local_158.data + lVar8);
            local_200 = (void *)((long)local_158.data + lVar15);
            local_1c0 = (long)local_158.data + local_1c0;
            lVar23 = (long)local_158.data + lVar23;
            local_180 = (long)local_158.data + local_180;
            local_1e8 = (void *)((long)local_158.data + lVar35);
            lVar28 = (long)local_158.data + lVar28;
            local_1d8 = (void *)((long)local_158.data + lVar21);
            local_1c8 = (long)local_158.data + local_1c8;
            if ((int)(uVar7 | 7) < (int)_w) {
              lVar32 = 0;
              lVar12 = 0;
              uVar6 = uVar7;
              do {
                auVar59 = vcvtps2ph_f16c(*(undefined1 (*) [32])(lVar28 + lVar12),3);
                auVar60 = vcvtps2ph_f16c(*(undefined1 (*) [32])(local_1a8 + lVar12),3);
                auVar61 = vcvtps2ph_f16c(*(undefined1 (*) [32])(local_1f0 + lVar12),3);
                auVar62 = vcvtps2ph_f16c(*(undefined1 (*) [32])(local_1b0 + lVar12),3);
                auVar63 = vcvtps2ph_f16c(*(undefined1 (*) [32])(local_1c0 + lVar12),3);
                auVar64 = vcvtps2ph_f16c(*(undefined1 (*) [32])(local_1c8 + lVar12),3);
                auVar65 = vcvtps2ph_f16c(*(undefined1 (*) [32])(local_1b8 + lVar12),3);
                auVar66 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_200 + lVar12),3);
                auVar67 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_1e8 + lVar12),3);
                auVar68 = vcvtps2ph_f16c(*(undefined1 (*) [32])(local_190 + lVar12),3);
                auVar70 = vcvtps2ph_f16c(*(undefined1 (*) [32])(local_180 + lVar12),3);
                auVar71 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_1d0 + lVar12),3);
                auVar72 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_1e0 + lVar12),3);
                auVar74 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_1d8 + lVar12),3);
                auVar75 = vcvtps2ph_f16c(*(undefined1 (*) [32])(local_188 + lVar12),3);
                auVar76 = vcvtps2ph_f16c(*(undefined1 (*) [32])(lVar23 + lVar12),3);
                auVar36._0_16_ = ZEXT116(0) * auVar67 + ZEXT116(1) * auVar59;
                auVar36._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar67;
                auVar37._0_16_ = ZEXT116(0) * auVar68 + ZEXT116(1) * auVar60;
                auVar37._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar68;
                auVar38._0_16_ = ZEXT116(0) * auVar70 + ZEXT116(1) * auVar61;
                auVar38._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar70;
                auVar39._0_16_ = ZEXT116(0) * auVar71 + ZEXT116(1) * auVar62;
                auVar39._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar71;
                auVar43._0_16_ = ZEXT116(0) * auVar72 + ZEXT116(1) * auVar63;
                auVar43._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar72;
                auVar56._0_16_ = ZEXT116(0) * auVar74 + ZEXT116(1) * auVar64;
                auVar56._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar74;
                auVar57._0_16_ = ZEXT116(0) * auVar75 + ZEXT116(1) * auVar65;
                auVar57._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar75;
                auVar58._0_16_ = ZEXT116(0) * auVar76 + ZEXT116(1) * auVar66;
                auVar58._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar76;
                auVar40 = vpunpcklwd_avx2(auVar36,auVar37);
                auVar36 = vpunpckhwd_avx2(auVar36,auVar37);
                auVar41 = vpunpcklwd_avx2(auVar38,auVar39);
                auVar37 = vpunpckhwd_avx2(auVar38,auVar39);
                auVar42 = vpunpcklwd_avx2(auVar43,auVar56);
                auVar38 = vpunpckhwd_avx2(auVar43,auVar56);
                auVar43 = vpunpcklwd_avx2(auVar57,auVar58);
                auVar39 = vpunpckhwd_avx2(auVar57,auVar58);
                auVar56 = vpunpckldq_avx2(auVar40,auVar41);
                auVar40 = vpunpckhdq_avx2(auVar40,auVar41);
                auVar41 = vpunpckldq_avx2(auVar36,auVar37);
                auVar36 = vpunpckhdq_avx2(auVar36,auVar37);
                auVar57 = vpunpckldq_avx2(auVar42,auVar43);
                auVar37 = vpunpckhdq_avx2(auVar42,auVar43);
                auVar42 = vpunpckldq_avx2(auVar38,auVar39);
                auVar38 = vpunpckhdq_avx2(auVar38,auVar39);
                auVar43 = vpunpcklqdq_avx2(auVar56,auVar57);
                auVar39 = vpunpckhqdq_avx2(auVar56,auVar57);
                auVar56 = vpunpcklqdq_avx2(auVar40,auVar37);
                auVar37 = vpunpckhqdq_avx2(auVar40,auVar37);
                auVar57 = vpunpcklqdq_avx2(auVar41,auVar42);
                auVar40 = vpunpckhqdq_avx2(auVar41,auVar42);
                auVar41 = vpunpcklqdq_avx2(auVar36,auVar38);
                auVar36 = vpunpckhqdq_avx2(auVar36,auVar38);
                *(undefined1 (*) [32])(lVar29 + lVar12 * 8) = auVar43;
                *(undefined1 (*) [32])(lVar29 + lVar12 * 8 + 0x20) = auVar39;
                *(undefined1 (*) [32])(lVar29 + lVar12 * 8 + 0x40) = auVar56;
                *(undefined1 (*) [32])(lVar29 + lVar12 * 8 + 0x60) = auVar37;
                *(undefined1 (*) [32])(lVar29 + lVar12 * 8 + 0x80) = auVar57;
                *(undefined1 (*) [32])(lVar29 + lVar12 * 8 + 0xa0) = auVar40;
                *(undefined1 (*) [32])(lVar29 + lVar12 * 8 + 0xc0) = auVar41;
                *(undefined1 (*) [32])(lVar29 + lVar12 * 8 + 0xe0) = auVar36;
                uVar7 = uVar6 + 8;
                lVar12 = lVar12 + 0x20;
                lVar32 = lVar32 + 0x100;
                iVar16 = uVar6 + 0xf;
                uVar6 = uVar7;
              } while (iVar16 < (int)_w);
              lVar29 = lVar29 + lVar32;
              lVar28 = lVar28 + lVar12;
              local_1a8 = local_1a8 + lVar12;
              local_1f0 = local_1f0 + lVar12;
              local_1b0 = local_1b0 + lVar12;
              local_1c0 = local_1c0 + lVar12;
              local_1c8 = local_1c8 + lVar12;
              local_1b8 = local_1b8 + lVar12;
              local_200 = (void *)((long)local_200 + lVar12);
              local_1e8 = (void *)((long)local_1e8 + lVar12);
              local_190 = local_190 + lVar12;
              local_180 = local_180 + lVar12;
              local_1d0 = (void *)((long)local_1d0 + lVar12);
              local_1e0 = (void *)((long)local_1e0 + lVar12);
              local_1d8 = (void *)((long)local_1d8 + lVar12);
              local_188 = local_188 + lVar12;
              lVar23 = lVar23 + lVar12;
            }
            iVar16 = _w - uVar7;
            local_a0 = lVar11;
            local_88 = lVar22;
            local_80 = lVar27;
            local_78 = lVar20;
            local_70 = lVar26;
            local_68 = lVar10;
            local_60 = lVar30;
            local_58 = lVar24;
            local_50 = lVar33;
            if (iVar16 != 0 && (int)uVar7 <= (int)_w) {
              lVar20 = 0;
              do {
                uVar5 = float32_to_float16(*(float *)(lVar28 + lVar20));
                *(unsigned_short *)(lVar29 + lVar20 * 8) = uVar5;
                uVar5 = float32_to_float16(*(float *)(local_1a8 + lVar20));
                *(unsigned_short *)(lVar29 + lVar20 * 8 + 2) = uVar5;
                uVar5 = float32_to_float16(*(float *)(local_1f0 + lVar20));
                *(unsigned_short *)(lVar29 + lVar20 * 8 + 4) = uVar5;
                uVar5 = float32_to_float16(*(float *)(local_1b0 + lVar20));
                *(unsigned_short *)(lVar29 + lVar20 * 8 + 6) = uVar5;
                uVar5 = float32_to_float16(*(float *)(local_1c0 + lVar20));
                *(unsigned_short *)(lVar29 + lVar20 * 8 + 8) = uVar5;
                uVar5 = float32_to_float16(*(float *)(local_1c8 + lVar20));
                *(unsigned_short *)(lVar29 + lVar20 * 8 + 10) = uVar5;
                uVar5 = float32_to_float16(*(float *)(local_1b8 + lVar20));
                *(unsigned_short *)(lVar29 + lVar20 * 8 + 0xc) = uVar5;
                uVar5 = float32_to_float16(*(float *)((long)local_200 + lVar20));
                *(unsigned_short *)(lVar29 + lVar20 * 8 + 0xe) = uVar5;
                uVar5 = float32_to_float16(*(float *)((long)local_1e8 + lVar20));
                *(unsigned_short *)(lVar29 + lVar20 * 8 + 0x10) = uVar5;
                uVar5 = float32_to_float16(*(float *)(local_190 + lVar20));
                *(unsigned_short *)(lVar29 + lVar20 * 8 + 0x12) = uVar5;
                uVar5 = float32_to_float16(*(float *)(local_180 + lVar20));
                *(unsigned_short *)(lVar29 + lVar20 * 8 + 0x14) = uVar5;
                uVar5 = float32_to_float16(*(float *)((long)local_1d0 + lVar20));
                *(unsigned_short *)(lVar29 + lVar20 * 8 + 0x16) = uVar5;
                uVar5 = float32_to_float16(*(float *)((long)local_1e0 + lVar20));
                *(unsigned_short *)(lVar29 + lVar20 * 8 + 0x18) = uVar5;
                uVar5 = float32_to_float16(*(float *)((long)local_1d8 + lVar20));
                *(unsigned_short *)(lVar29 + lVar20 * 8 + 0x1a) = uVar5;
                uVar5 = float32_to_float16(*(float *)(local_188 + lVar20));
                *(unsigned_short *)(lVar29 + lVar20 * 8 + 0x1c) = uVar5;
                uVar5 = float32_to_float16(*(float *)(lVar23 + lVar20));
                *(unsigned_short *)(lVar29 + lVar20 * 8 + 0x1e) = uVar5;
                lVar20 = lVar20 + 4;
                iVar16 = iVar16 + -1;
              } while (iVar16 != 0);
            }
            local_168 = local_168 + 0x10;
            local_d8 = local_d8 + 1;
            lVar33 = local_50 + 0x10;
            lVar24 = local_58 + 0x10;
            lVar30 = local_60 + 0x10;
            lVar10 = local_68 + 0x10;
            lVar26 = local_70 + 0x10;
            lVar20 = local_78 + 0x10;
            lVar27 = local_80 + 0x10;
            lVar22 = local_88 + 0x10;
            lVar11 = local_a0 + 0x10;
            local_a8 = local_a8 + 0x10;
            local_b0 = local_b0 + 0x10;
            local_b8 = local_b8 + 0x10;
            local_c0 = local_c0 + 0x10;
            local_c8 = local_c8 + 0x10;
            local_d0 = local_d0 + 0x10;
          } while ((int)((uint)local_168 | 0xf) < (int)_h);
        }
        if (local_158.refcount != (int *)0x0) {
          LOCK();
          *local_158.refcount = *local_158.refcount + -1;
          UNLOCK();
          if (*local_158.refcount == 0) {
            if (local_158.allocator == (Allocator *)0x0) {
              if (local_158.data != (void *)0x0) {
                free(local_158.data);
              }
            }
            else {
              (*(local_158.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      goto LAB_002cb232;
    }
    Mat::reshape(&local_158,this_00,_w,_h,(Allocator *)0x0);
    uVar7 = _h + 7;
    if (-1 < (int)_h) {
      uVar7 = _h;
    }
    Mat::create(this_01,_w,(int)uVar7 >> 3,0x10,8,(Allocator *)0x0);
    if (7 < (int)_h) {
      local_110 = (void *)(CONCAT44(local_110._4_4_,_w) & 0xfffffffffffffff0);
      lVar20 = 7;
      lVar24 = 6;
      lVar30 = 5;
      lVar10 = 4;
      lVar26 = 3;
      lVar11 = 2;
      lVar22 = 1;
      local_198 = 0;
      local_1f0 = 0;
      do {
        lVar33 = (long)(this->weight_data_tm).w;
        pvVar1 = (this->weight_data_tm).data;
        sVar2 = (this->weight_data_tm).elemsize;
        lVar27 = (long)local_158.w;
        if ((int)_w < 0x10) {
          puVar31 = (unsigned_short *)((long)pvVar1 + (local_1f0 >> 3) * lVar33 * sVar2);
          lVar27 = local_158.elemsize * lVar27;
          pvVar19 = (void *)(lVar27 * local_1f0 + (long)local_158.data);
          pvVar13 = (void *)((local_1f0 | 1) * lVar27 + (long)local_158.data);
          local_200 = (void *)((local_1f0 | 2) * lVar27 + (long)local_158.data);
          local_1e8 = (void *)((local_1f0 | 3) * lVar27 + (long)local_158.data);
          local_1d0 = (void *)((local_1f0 | 4) * lVar27 + (long)local_158.data);
          local_1d8 = (void *)((local_1f0 | 5) * lVar27 + (long)local_158.data);
          local_1e0 = (void *)((local_1f0 | 6) * lVar27 + (long)local_158.data);
          pvVar9 = (void *)(lVar27 * (local_1f0 | 7) + (long)local_158.data);
          uVar7 = 0;
        }
        else {
          local_108 = (void *)(local_158.elemsize * lVar20 * lVar27);
          lVar28 = local_158.elemsize * lVar24 * lVar27;
          lVar12 = local_158.elemsize * lVar30 * lVar27;
          lVar32 = local_158.elemsize * lVar10 * lVar27;
          lVar15 = local_158.elemsize * lVar26 * lVar27;
          lVar35 = local_158.elemsize * lVar11 * lVar27;
          lVar8 = local_158.elemsize * lVar22 * lVar27;
          lVar27 = local_158.elemsize * local_1f0 * lVar27;
          local_100 = (void *)(sVar2 * local_198 * lVar33);
          local_f8 = local_158.data;
          iVar16 = 0xf;
          lVar25 = 0;
          lVar33 = 0;
          do {
            auVar36 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                         ((long)local_158.data + lVar33 + lVar27),3);
            auVar37 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                         ((long)local_158.data + lVar33 + lVar8),3);
            auVar38 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                         ((long)local_158.data + lVar33 + lVar35),3);
            auVar39 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                         ((long)local_158.data + lVar33 + lVar15),3);
            auVar43 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                         ((long)local_158.data + lVar33 + lVar32),3);
            auVar56 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                         ((long)local_158.data + lVar33 + lVar12),3);
            auVar57 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                         ((long)local_158.data + lVar33 + lVar28),3);
            auVar58 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                         ((long)((long)local_108 + (long)local_158.data) + lVar33),3
                                       );
            auVar40 = vpunpcklwd_avx2(auVar36,auVar37);
            auVar36 = vpunpckhwd_avx2(auVar36,auVar37);
            auVar41 = vpunpcklwd_avx2(auVar38,auVar39);
            auVar37 = vpunpckhwd_avx2(auVar38,auVar39);
            auVar42 = vpunpcklwd_avx2(auVar43,auVar56);
            auVar38 = vpunpckhwd_avx2(auVar43,auVar56);
            auVar43 = vpunpcklwd_avx2(auVar57,auVar58);
            auVar39 = vpunpckhwd_avx2(auVar57,auVar58);
            auVar56 = vpunpckldq_avx2(auVar40,auVar41);
            auVar40 = vpunpckhdq_avx2(auVar40,auVar41);
            auVar41 = vpunpckldq_avx2(auVar36,auVar37);
            auVar36 = vpunpckhdq_avx2(auVar36,auVar37);
            auVar57 = vpunpckldq_avx2(auVar42,auVar43);
            auVar37 = vpunpckhdq_avx2(auVar42,auVar43);
            auVar42 = vpunpckldq_avx2(auVar38,auVar39);
            auVar38 = vpunpckhdq_avx2(auVar38,auVar39);
            auVar43 = vpunpcklqdq_avx2(auVar56,auVar57);
            auVar39 = vpunpckhqdq_avx2(auVar56,auVar57);
            auVar56 = vpunpcklqdq_avx2(auVar40,auVar37);
            auVar37 = vpunpckhqdq_avx2(auVar40,auVar37);
            auVar57 = vpunpcklqdq_avx2(auVar41,auVar42);
            auVar40 = vpunpckhqdq_avx2(auVar41,auVar42);
            auVar41 = vpunpcklqdq_avx2(auVar36,auVar38);
            auVar36 = vpunpckhqdq_avx2(auVar36,auVar38);
            auVar42._0_16_ = ZEXT116(0) * auVar39._0_16_ + ZEXT116(1) * auVar43._0_16_;
            auVar42._16_16_ = ZEXT116(0) * auVar43._16_16_ + ZEXT116(1) * auVar39._0_16_;
            auVar69._0_16_ = ZEXT116(0) * auVar37._0_16_ + ZEXT116(1) * auVar56._0_16_;
            auVar69._16_16_ = ZEXT116(0) * auVar56._16_16_ + ZEXT116(1) * auVar37._0_16_;
            auVar44._0_16_ = ZEXT116(0) * auVar40._0_16_ + ZEXT116(1) * auVar57._0_16_;
            auVar44._16_16_ = ZEXT116(0) * auVar57._16_16_ + ZEXT116(1) * auVar40._0_16_;
            auVar45._0_16_ = ZEXT116(0) * auVar36._0_16_ + ZEXT116(1) * auVar41._0_16_;
            auVar45._16_16_ = ZEXT116(0) * auVar41._16_16_ + ZEXT116(1) * auVar36._0_16_;
            auVar38 = vperm2i128_avx2(auVar43,auVar39,0x31);
            auVar37 = vperm2i128_avx2(auVar56,auVar37,0x31);
            auVar39 = vperm2i128_avx2(auVar57,auVar40,0x31);
            auVar36 = vperm2i128_avx2(auVar41,auVar36,0x31);
            *(undefined1 (*) [32])((long)local_100 + (long)(lVar33 * 4 + (long)pvVar1)) = auVar42;
            *(undefined1 (*) [32])((long)local_100 + (long)pvVar1 + lVar33 * 4 + 0x20) = auVar69;
            *(undefined1 (*) [32])((long)local_100 + (long)pvVar1 + lVar33 * 4 + 0x40) = auVar44;
            *(undefined1 (*) [32])((long)local_100 + (long)pvVar1 + lVar33 * 4 + 0x60) = auVar45;
            *(undefined1 (*) [32])((long)local_100 + (long)pvVar1 + lVar33 * 4 + 0x80) = auVar38;
            *(undefined1 (*) [32])((long)local_100 + (long)pvVar1 + lVar33 * 4 + 0xa0) = auVar37;
            *(undefined1 (*) [32])((long)local_100 + (long)pvVar1 + lVar33 * 4 + 0xc0) = auVar39;
            *(undefined1 (*) [32])((long)local_100 + (long)pvVar1 + lVar33 * 4 + 0xe0) = auVar36;
            iVar16 = iVar16 + 0x10;
            lVar33 = lVar33 + 0x40;
            lVar25 = lVar25 + 0x100;
          } while (iVar16 < (int)_w);
          lVar33 = (long)local_158.data + lVar33;
          pvVar9 = (void *)((long)local_108 + lVar33);
          local_1e0 = (void *)(lVar28 + lVar33);
          local_1d8 = (void *)(lVar12 + lVar33);
          local_1d0 = (void *)(lVar32 + lVar33);
          local_1e8 = (void *)(lVar15 + lVar33);
          local_200 = (void *)(lVar35 + lVar33);
          pvVar13 = (void *)(lVar8 + lVar33);
          pvVar19 = (void *)(lVar33 + lVar27);
          puVar31 = (unsigned_short *)((long)pvVar1 + lVar25 + (long)local_100);
          uVar7 = (uint)local_110;
        }
        if ((int)(uVar7 | 7) < (int)_w) {
          lVar33 = 0;
          lVar27 = 0;
          uVar6 = uVar7;
          do {
            auVar59 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)pvVar19 + lVar27),3);
            auVar60 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)pvVar13 + lVar27),3);
            auVar61 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_200 + lVar27),3);
            auVar62 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_1e8 + lVar27),3);
            auVar66 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_1d0 + lVar27),3);
            auVar67 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_1d8 + lVar27),3);
            auVar68 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_1e0 + lVar27),3);
            auVar70 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)pvVar9 + lVar27),3);
            auVar63 = vpunpcklwd_avx(auVar59,auVar60);
            auVar59 = vpunpckhwd_avx(auVar59,auVar60);
            auVar64 = vpunpcklwd_avx(auVar61,auVar62);
            auVar60 = vpunpckhwd_avx(auVar61,auVar62);
            auVar65 = vpunpcklwd_avx(auVar66,auVar67);
            auVar61 = vpunpckhwd_avx(auVar66,auVar67);
            auVar66 = vpunpcklwd_avx(auVar68,auVar70);
            auVar62 = vpunpckhwd_avx(auVar68,auVar70);
            auVar67 = vpunpckldq_avx(auVar63,auVar64);
            auVar63 = vpunpckhdq_avx(auVar63,auVar64);
            auVar64 = vpunpckldq_avx(auVar59,auVar60);
            auVar59 = vpunpckhdq_avx(auVar59,auVar60);
            auVar68 = vpunpckldq_avx(auVar65,auVar66);
            auVar60 = vpunpckhdq_avx(auVar65,auVar66);
            auVar65 = vpunpckldq_avx(auVar61,auVar62);
            auVar61 = vpunpckhdq_avx(auVar61,auVar62);
            auVar66 = vpunpcklqdq_avx(auVar67,auVar68);
            auVar62 = vpunpckhqdq_avx(auVar67,auVar68);
            auVar67 = vpunpcklqdq_avx(auVar63,auVar60);
            auVar60 = vpunpckhqdq_avx(auVar63,auVar60);
            auVar68 = vpunpcklqdq_avx(auVar64,auVar65);
            auVar63 = vpunpckhqdq_avx(auVar64,auVar65);
            auVar64 = vpunpcklqdq_avx(auVar59,auVar61);
            auVar59 = vpunpckhqdq_avx(auVar59,auVar61);
            *(undefined1 (*) [16])(puVar31 + lVar27 * 2) = auVar66;
            *(undefined1 (*) [16])(puVar31 + lVar27 * 2 + 8) = auVar62;
            *(undefined1 (*) [16])(puVar31 + lVar27 * 2 + 0x10) = auVar67;
            *(undefined1 (*) [16])(puVar31 + lVar27 * 2 + 0x18) = auVar60;
            *(undefined1 (*) [16])(puVar31 + lVar27 * 2 + 0x20) = auVar68;
            *(undefined1 (*) [16])(puVar31 + lVar27 * 2 + 0x28) = auVar63;
            *(undefined1 (*) [16])(puVar31 + lVar27 * 2 + 0x30) = auVar64;
            *(undefined1 (*) [16])(puVar31 + lVar27 * 2 + 0x38) = auVar59;
            uVar7 = uVar6 + 8;
            iVar16 = uVar6 + 0xf;
            lVar27 = lVar27 + 0x20;
            lVar33 = lVar33 + 0x80;
            uVar6 = uVar7;
          } while (iVar16 < (int)_w);
          pvVar9 = (void *)((long)pvVar9 + lVar27);
          local_1e0 = (void *)((long)local_1e0 + lVar27);
          local_1d8 = (void *)((long)local_1d8 + lVar27);
          local_1d0 = (void *)((long)local_1d0 + lVar27);
          local_1e8 = (void *)((long)local_1e8 + lVar27);
          local_200 = (void *)((long)local_200 + lVar27);
          pvVar13 = (void *)((long)pvVar13 + lVar27);
          pvVar19 = (void *)((long)pvVar19 + lVar27);
          puVar31 = (unsigned_short *)((long)puVar31 + lVar33);
        }
        if ((int)uVar7 < (int)_w) {
          lVar33 = 0;
          do {
            uVar5 = float32_to_float16(*(float *)((long)pvVar19 + lVar33 * 4));
            *puVar31 = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar13 + lVar33 * 4));
            puVar31[1] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)local_200 + lVar33 * 4));
            puVar31[2] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)local_1e8 + lVar33 * 4));
            puVar31[3] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)local_1d0 + lVar33 * 4));
            puVar31[4] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)local_1d8 + lVar33 * 4));
            puVar31[5] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)local_1e0 + lVar33 * 4));
            puVar31[6] = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar9 + lVar33 * 4));
            puVar31[7] = uVar5;
            puVar31 = puVar31 + 8;
            lVar33 = lVar33 + 1;
          } while (_w - uVar7 != (int)lVar33);
        }
        local_1f0 = local_1f0 + 8;
        lVar20 = lVar20 + 8;
        lVar24 = lVar24 + 8;
        lVar30 = lVar30 + 8;
        lVar10 = lVar10 + 8;
        lVar26 = lVar26 + 8;
        lVar11 = lVar11 + 8;
        lVar22 = lVar22 + 8;
        local_198 = local_198 + 1;
      } while ((int)((uint)local_1f0 | 7) < (int)_h);
    }
    if (local_158.refcount != (int *)0x0) {
      LOCK();
      *local_158.refcount = *local_158.refcount + -1;
      UNLOCK();
      if (*local_158.refcount == 0) {
        if (local_158.allocator == (Allocator *)0x0) {
          if (local_158.data != (void *)0x0) {
            free(local_158.data);
          }
        }
        else {
          (*(local_158.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  if (bVar14 == 1) {
    Mat::reshape(&local_158,this_00,_w,_h,(Allocator *)0x0);
    cast_float32_to_float16(&local_158,this_01,local_e8);
    if (local_158.refcount != (int *)0x0) {
      LOCK();
      *local_158.refcount = *local_158.refcount + -1;
      UNLOCK();
      if (*local_158.refcount == 0) {
        if (local_158.allocator == (Allocator *)0x0) {
          if (local_158.data != (void *)0x0) {
            free(local_158.data);
          }
        }
        else {
          (*(local_158.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else if (bVar14 == 4) {
    Mat::reshape(&local_158,this_00,_w,_h,(Allocator *)0x0);
    uVar7 = _h + 3;
    if (-1 < (int)_h) {
      uVar7 = _h;
    }
    Mat::create(this_01,_w,(int)uVar7 >> 2,8,4,(Allocator *)0x0);
    if (3 < (int)_h) {
      local_1c8._0_4_ = _w & 0xfffffffc;
      lVar20 = 3;
      lVar22 = 2;
      lVar24 = 1;
      lVar30 = 0;
      uVar34 = 0;
      do {
        pvVar9 = local_158.data;
        lVar10 = (long)(this->weight_data_tm).w;
        pvVar1 = (this->weight_data_tm).data;
        sVar2 = (this->weight_data_tm).elemsize;
        pauVar17 = (undefined1 (*) [16])((uVar34 >> 2) * lVar10 * sVar2 + (long)pvVar1);
        lVar26 = (long)local_158.w;
        if ((int)_w < 4) {
          lVar26 = local_158.elemsize * lVar26;
          lVar28 = lVar26 * uVar34;
          lVar27 = (uVar34 | 1) * lVar26;
          lVar33 = (uVar34 | 2) * lVar26;
          lVar11 = lVar26 * (uVar34 | 3);
          uVar7 = 0;
        }
        else {
          lVar11 = local_158.elemsize * lVar20 * lVar26;
          lVar33 = local_158.elemsize * lVar22 * lVar26;
          lVar27 = local_158.elemsize * lVar24 * lVar26;
          lVar26 = local_158.elemsize * uVar34 * lVar26;
          iVar16 = 3;
          lVar28 = 0;
          do {
            pauVar18 = pauVar17;
            auVar59 = *(undefined1 (*) [16])((long)local_158.data + lVar28 + lVar26);
            auVar60 = *(undefined1 (*) [16])((long)local_158.data + lVar28 + lVar27);
            auVar61 = *(undefined1 (*) [16])((long)local_158.data + lVar28 + lVar33);
            auVar62 = *(undefined1 (*) [16])((long)local_158.data + lVar28 + lVar11);
            auVar63 = vpunpckldq_avx(auVar59,auVar60);
            auVar64 = vpunpckldq_avx(auVar61,auVar62);
            auVar59 = vpunpckhdq_avx(auVar59,auVar60);
            auVar60 = vpunpckhdq_avx(auVar61,auVar62);
            auVar62 = vpunpcklqdq_avx(auVar63,auVar64);
            auVar61 = vpunpckhqdq_avx(auVar63,auVar64);
            auVar63 = vpunpcklqdq_avx(auVar59,auVar60);
            auVar59 = vpunpckhqdq_avx(auVar59,auVar60);
            auVar41._0_16_ = ZEXT116(0) * auVar61 + ZEXT116(1) * auVar62;
            auVar41._16_16_ = ZEXT116(1) * auVar61;
            auVar40._0_16_ = ZEXT116(0) * auVar59 + ZEXT116(1) * auVar63;
            auVar40._16_16_ = ZEXT116(1) * auVar59;
            pauVar17 = (undefined1 (*) [16])((long)pvVar1 + lVar28 * 2 + sVar2 * lVar30 * lVar10);
            auVar59 = vcvtps2ph_f16c(auVar41,3);
            *pauVar17 = auVar59;
            auVar59 = vcvtps2ph_f16c(auVar40,3);
            pauVar17[1] = auVar59;
            iVar16 = iVar16 + 4;
            lVar28 = lVar28 + 0x10;
            pauVar17 = pauVar17 + 2;
          } while (iVar16 < (int)_w);
          pauVar17 = pauVar18 + 2;
          lVar11 = lVar11 + lVar28;
          lVar33 = lVar33 + lVar28;
          lVar27 = lVar27 + lVar28;
          lVar28 = lVar26 + lVar28;
          uVar7 = (uint)local_1c8;
        }
        if ((int)uVar7 < (int)_w) {
          lVar10 = 0;
          do {
            uVar5 = float32_to_float16(*(float *)((long)pvVar9 + lVar10 * 4 + lVar28));
            *(unsigned_short *)(*pauVar17 + lVar10 * 8) = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar9 + lVar10 * 4 + lVar27));
            *(unsigned_short *)(*pauVar17 + lVar10 * 8 + 2) = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar9 + lVar10 * 4 + lVar33));
            *(unsigned_short *)(*pauVar17 + lVar10 * 8 + 4) = uVar5;
            uVar5 = float32_to_float16(*(float *)((long)pvVar9 + lVar10 * 4 + lVar11));
            *(unsigned_short *)(*pauVar17 + lVar10 * 8 + 6) = uVar5;
            lVar10 = lVar10 + 1;
          } while (_w - uVar7 != (int)lVar10);
        }
        uVar34 = uVar34 + 4;
        lVar20 = lVar20 + 4;
        lVar22 = lVar22 + 4;
        lVar24 = lVar24 + 4;
        lVar30 = lVar30 + 1;
      } while ((int)((uint)uVar34 | 3) < (int)_h);
    }
    if (local_158.refcount != (int *)0x0) {
      LOCK();
      *local_158.refcount = *local_158.refcount + -1;
      UNLOCK();
      if (*local_158.refcount == 0) {
        if (local_158.allocator == (Allocator *)0x0) {
          if (local_158.data != (void *)0x0) {
            free(local_158.data);
          }
        }
        else {
          (*(local_158.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
LAB_002cb232:
  if (local_e8->lightmode == true) {
    piVar3 = (this->super_InnerProduct).weight_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pvVar1 = (this->super_InnerProduct).weight_data.data;
        pAVar4 = (this->super_InnerProduct).weight_data.allocator;
        if (pAVar4 == (Allocator *)0x0) {
          if (pvVar1 != (void *)0x0) {
            free(pvVar1);
          }
        }
        else {
          (*pAVar4->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_InnerProduct).weight_data.cstep = 0;
    *(undefined1 (*) [16])((long)&(this->super_InnerProduct).weight_data.refcount + 4) =
         (undefined1  [16])0x0;
    this_00->data = (void *)0x0;
    this_00->refcount = (int *)0x0;
    (this->super_InnerProduct).weight_data.dims = 0;
    (this->super_InnerProduct).weight_data.w = 0;
    (this->super_InnerProduct).weight_data.h = 0;
    (this->super_InnerProduct).weight_data.d = 0;
    (this->super_InnerProduct).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int InnerProduct_x86_avx512::create_pipeline_fp16s(const Option& opt)
{
    const int num_input = weight_data_size / num_output;

    innerproduct_transform_kernel_fp16s_sse(weight_data, weight_data_tm, num_input, num_output, opt);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}